

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::inc_r(GB *this,u8 *r)

{
  byte bVar1;
  
  bVar1 = *r + 1;
  (this->s).field_2.field_0.f =
       (*r ^ bVar1) * '\x02' & 0x20 | (bVar1 == 0) << 7 | (this->s).field_2.field_0.f & 0x10;
  *r = bVar1;
  (this->s).op_tick = -2;
  return;
}

Assistant:

void GB::inc_r(u8& r) {
  r = inc(r);
  op_done();
}